

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Versions.cpp
# Opt level: O0

void __thiscall glslang::TParseVersions::doubleCheck(TParseVersions *this,TSourceLoc *loc,char *op)

{
  char *local_38;
  char *f64_Extensions [2];
  char *op_local;
  TSourceLoc *loc_local;
  TParseVersions *this_local;
  
  if (this->language == EShLangVertex) {
    local_38 = "GL_ARB_gpu_shader_fp64";
    f64_Extensions[0] = "GL_ARB_vertex_attrib_64bit";
    profileRequires(this,loc,6,400,2,&local_38,op);
  }
  else {
    profileRequires(this,loc,6,400,"GL_ARB_gpu_shader_fp64",op);
  }
  return;
}

Assistant:

void TParseVersions::doubleCheck(const TSourceLoc& loc, const char* op)
{

    //requireProfile(loc, ECoreProfile | ECompatibilityProfile, op);
    if (language == EShLangVertex) {
        const char* const f64_Extensions[] = {E_GL_ARB_gpu_shader_fp64, E_GL_ARB_vertex_attrib_64bit};
        profileRequires(loc, ECoreProfile | ECompatibilityProfile, 400, 2, f64_Extensions, op);
    } else
        profileRequires(loc, ECoreProfile | ECompatibilityProfile, 400, E_GL_ARB_gpu_shader_fp64, op);
}